

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void TableSettingsHandler_ApplyAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)(uint)(ctx->Tables).Buf.Size;
  if (uVar2 != 0) {
    pIVar1 = (ctx->Tables).Buf.Data;
    lVar3 = 0;
    do {
      (&pIVar1->IsSettingsRequestLoad)[lVar3] = true;
      *(undefined4 *)((long)pIVar1->RowBgColor + lVar3 + -0x34) = 0xffffffff;
      lVar3 = lVar3 + 600;
    } while (uVar2 * 600 - lVar3 != 0);
  }
  return;
}

Assistant:

static void TableSettingsHandler_ApplyAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
    {
        ImGuiTable* table = g.Tables.GetByIndex(i);
        table->IsSettingsRequestLoad = true;
        table->SettingsOffset = -1;
    }
}